

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecuteProcessCommand.cxx
# Opt level: O2

void anon_unknown.dwarf_2ef6ec::cmExecuteProcessCommandFixText
               (vector<char,_std::allocator<char>_> *output,bool strip_trailing_whitespace)

{
  char cVar1;
  pointer pcVar2;
  uint uVar3;
  int iVar4;
  ulong in_RAX;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 uStack_28;
  
  uVar3 = 0;
  uVar6 = 0;
  do {
    pcVar2 = (output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (long)(output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pcVar2;
    uVar7 = (ulong)uVar6;
    do {
      uVar8 = (ulong)uVar3;
      if (uVar5 <= uVar7) {
        uStack_28 = in_RAX;
        if (strip_trailing_whitespace && uVar3 != 0) goto LAB_001a23b3;
        goto LAB_001a23d9;
      }
      iVar4 = (int)uVar7;
      uVar6 = iVar4 + 1;
      cVar1 = pcVar2[uVar7];
      uVar7 = (ulong)uVar6;
    } while ((cVar1 == '\0') || (((cVar1 == '\r' && (uVar6 < uVar5)) && (pcVar2[uVar6] == '\n'))));
    uVar3 = uVar3 + 1;
    pcVar2[uVar8] = cVar1;
    uVar6 = iVar4 + 1;
  } while( true );
LAB_001a23b3:
  cVar1 = pcVar2[uVar8 - 1];
  iVar4 = isspace((int)cVar1);
  if (((iVar4 == 0) && (cVar1 != '\r')) && (cVar1 != '\n')) {
    uVar3 = (uint)uVar8;
    goto LAB_001a23d9;
  }
  uVar8 = uVar8 - 1;
  if (uVar8 == 0) {
    uVar3 = 0;
LAB_001a23d9:
    std::vector<char,_std::allocator<char>_>::resize(output,(ulong)uVar3);
    uStack_28 = uStack_28 & 0xffffffffffffff;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>
              (output,(char *)((long)&uStack_28 + 7));
    return;
  }
  goto LAB_001a23b3;
}

Assistant:

void cmExecuteProcessCommandFixText(std::vector<char>& output,
                                    bool strip_trailing_whitespace)
{
  // Remove \0 characters and the \r part of \r\n pairs.
  unsigned int in_index = 0;
  unsigned int out_index = 0;
  while (in_index < output.size()) {
    char c = output[in_index++];
    if ((c != '\r' ||
         !(in_index < output.size() && output[in_index] == '\n')) &&
        c != '\0') {
      output[out_index++] = c;
    }
  }

  // Remove trailing whitespace if requested.
  if (strip_trailing_whitespace) {
    while (out_index > 0 &&
           cmExecuteProcessCommandIsWhitespace(output[out_index - 1])) {
      --out_index;
    }
  }

  // Shrink the vector to the size needed.
  output.resize(out_index);

  // Put a terminator on the text string.
  output.push_back('\0');
}